

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

int transform_wrapper(CManager cm,_event_item *event,void *client_data,attr_list attrs,int out_count
                     ,int *out_stones)

{
  undefined8 uVar1;
  int iVar2;
  __pid_t _Var3;
  undefined8 uVar4;
  long lVar5;
  pthread_t pVar6;
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  int *in_R9;
  timespec ts;
  FMFormat f;
  _EVSource s;
  attr_list output_attrs;
  ev_state_data ev_state;
  cod_exec_context ec;
  _func_int_cod_exec_context_void_ptr_void_ptr_attr_list_attr_list *func;
  void *out_event;
  int ret;
  response_instance_conflict instance;
  void *in_stack_fffffffffffffef8;
  FILE *in_stack_ffffffffffffff00;
  void *in_stack_ffffffffffffff08;
  EVsource in_stack_ffffffffffffff10;
  long local_e8;
  undefined8 in_stack_ffffffffffffff38;
  CMTraceType trace_type;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  long local_a0;
  long local_98;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  int *local_80;
  long local_58;
  code *local_50;
  void *local_48;
  uint local_3c;
  long local_38;
  int *local_30;
  undefined4 local_24;
  undefined8 local_20;
  long local_10;
  long local_8;
  
  trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_38 = in_RDX;
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_48 = INT_CMmalloc((size_t)in_stack_ffffffffffffff00);
  local_50 = (code *)0x0;
  local_58 = *(long *)(local_38 + 0x20);
  uVar4 = create_attr_list();
  local_a0 = local_8;
  local_98 = local_10;
  local_90 = *(undefined4 *)(local_38 + 4);
  local_8c = *(undefined4 *)(local_38 + 8);
  local_88 = local_24;
  local_80 = local_30;
  iVar2 = CMtrace_val[10];
  if (*(long *)(local_8 + 0x120) == 0) {
    iVar2 = CMtrace_init((CManager)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         trace_type);
  }
  if (iVar2 != 0) {
    fprintf(*(FILE **)(local_8 + 0x120),"Input Transform Event is :\n");
    if (*(long *)(local_10 + 0x30) == 0) {
      fprintf(*(FILE **)(local_8 + 0x120),"       ****  UNFORMATTED  ****\n");
    }
    else {
      FMfdump_data(*(undefined8 *)(local_8 + 0x120),*(undefined8 *)(local_10 + 0x30),
                   *(undefined8 *)(local_10 + 0x20),0x2800);
    }
  }
  memset(local_48,0,(long)*(int *)(local_38 + 0x28));
  if (local_58 == 0) {
    local_3c = (**(code **)(local_38 + 0x10))
                         (*(undefined8 *)(local_10 + 0x20),local_48,local_20,uVar4);
  }
  else {
    local_50 = (code *)**(undefined8 **)(local_38 + 0x18);
    cod_assoc_client_data(local_58,0x34567890,&local_a0);
    local_3c = (*local_50)(local_58,*(undefined8 *)(local_10 + 0x20),local_48,local_20,uVar4);
  }
  if ((local_3c != 0) && (*local_30 == -1)) {
    printf("Transform output stone ID not set, event discarded\n");
    local_3c = 0;
  }
  if (local_3c == 0) {
    iVar2 = CMtrace_val[10];
    if (*(long *)(local_8 + 0x120) == 0) {
      iVar2 = CMtrace_init((CManager)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           trace_type);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        in_stack_ffffffffffffff00 = *(FILE **)(local_8 + 0x120);
        _Var3 = getpid();
        lVar5 = (long)_Var3;
        pVar6 = pthread_self();
        fprintf(in_stack_ffffffffffffff00,"P%lxT%lx - ",lVar5,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&stack0xffffffffffffff10);
        fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffff10,local_e8);
      }
      fprintf(*(FILE **)(local_8 + 0x120),"Transform function returned %d, NOT submitting\n",
              (ulong)local_3c);
    }
    fflush(*(FILE **)(local_8 + 0x120));
    transform_free_wrapper(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  else {
    iVar2 = CMtrace_val[10];
    if (*(long *)(local_8 + 0x120) == 0) {
      iVar2 = CMtrace_init((CManager)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           trace_type);
    }
    if (iVar2 != 0) {
      uVar1 = *(undefined8 *)(local_38 + 0x38);
      fprintf(*(FILE **)(local_8 + 0x120)," Transform function returned %d, submitting further\n",
              (ulong)local_3c);
      FMfdump_data(*(undefined8 *)(local_8 + 0x120),uVar1,local_48,0x2800);
    }
    INT_EVsubmit(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (attr_list)in_stack_ffffffffffffff00);
  }
  free_attr_list(uVar4);
  return local_3c;
}

Assistant:

static int
transform_wrapper(CManager cm, struct _event_item *event, void *client_data,
		  attr_list attrs, int out_count, int *out_stones)
{
    response_instance instance = (response_instance)client_data;
    int ret;
    void *out_event = malloc(instance->u.transform.out_size);
    int(*func)(cod_exec_context, void *, void*, attr_list, attr_list) = NULL;
    cod_exec_context ec = instance->u.transform.ec;
    struct ev_state_data ev_state;
    attr_list output_attrs = create_attr_list();

    ev_state.cm = cm;
    ev_state.cur_event = event;
    ev_state.stone = instance->stone;
    ev_state.proto_action_id = instance->proto_action_id;
    ev_state.out_count = out_count;
    ev_state.out_stones = out_stones;

    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Input Transform Event is :\n");
	if (event->reference_format) {
	    FMfdump_data(cm->CMTrace_file, event->reference_format, event->decoded_event, 10240);
	} else {
	    fprintf(cm->CMTrace_file, "       ****  UNFORMATTED  ****\n");
	}
    }
    memset(out_event, 0, instance->u.transform.out_size);
    if (ec != NULL) {
#ifdef HAVE_COD_H
	func = (int(*)(cod_exec_context, void *, void*, attr_list, attr_list))instance->u.transform.code->func;
	cod_assoc_client_data(ec, 0x34567890, (intptr_t)&ev_state);
	ret = func(ec, event->decoded_event, out_event, attrs, output_attrs);
#endif
    } else {
	/* DLL-based handler */
	ret = ((int(*)(void *, void *, attr_list, attr_list))instance->u.transform.func_ptr)(event->decoded_event, out_event, attrs, output_attrs);
    }

    if (ret && (out_stones[0] == -1)) {
	printf("Transform output stone ID not set, event discarded\n");
	ret = 0;
    }
    if (ret) {
	struct _EVSource s;
	if (CMtrace_on(cm, EVerbose)) {
	    FMFormat f = instance->u.transform.out_format;
	    fprintf(cm->CMTrace_file, " Transform function returned %d, submitting further\n", ret);
	    FMfdump_data(cm->CMTrace_file, f, out_event, 10240);
	}
	s.local_stone_id = out_stones[0];
	s.cm = cm;
	s.format = NULL;
	s.reference_format = instance->u.transform.out_format;
	s.free_func = transform_free_wrapper;
	s.free_data = instance->u.transform.out_format;
	s.preencoded = 0;
	INT_EVsubmit(&s, out_event, output_attrs);
    } else {
	CMtrace_out(cm, EVerbose, "Transform function returned %d, NOT submitting\n", ret);
	transform_free_wrapper(out_event, instance->u.transform.out_format);
    }
    free_attr_list(output_attrs);
    return ret;
}